

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void PrintConstant(InstructionVMGraphContext *ctx,VmConstant *constant)

{
  bool bVar1;
  float fVar2;
  VmConstant *constant_local;
  InstructionVMGraphContext *ctx_local;
  
  bVar1 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Void);
  if (bVar1) {
    Print(ctx,"{}");
  }
  else {
    bVar1 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Int);
    if ((bVar1) && ((constant->isFloat & 1U) != 0)) {
      fVar2 = anon_unknown.dwarf_1b7e48::DecodeFloat(constant->iValue);
      Print(ctx,"%ff",(double)fVar2);
    }
    else {
      bVar1 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Int);
      if (bVar1) {
        Print(ctx,"%d",(ulong)(uint)constant->iValue);
      }
      else {
        bVar1 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Double);
        if (bVar1) {
          Print(ctx,"%f",constant->dValue);
        }
        else {
          bVar1 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Long);
          if (bVar1) {
            Print(ctx,"%lldl",constant->lValue);
          }
          else if ((((constant->super_VmValue).type.type == VM_TYPE_POINTER) &&
                   (constant->container != (VariableData *)0x0)) &&
                  ((ctx->showContainers & 1U) != 0)) {
            Print(ctx,"%.*s+0x%x",
                  (ulong)(uint)((int)(constant->container->name->name).end -
                               (int)(constant->container->name->name).begin),
                  (constant->container->name->name).begin,(ulong)(uint)constant->iValue);
          }
          else if (((constant->super_VmValue).type.type == VM_TYPE_POINTER) &&
                  (constant->container != (VariableData *)0x0)) {
            Print(ctx,"0x%x",(ulong)(constant->container->offset + constant->iValue));
          }
          else if ((constant->super_VmValue).type.type == VM_TYPE_POINTER) {
            Print(ctx,"0x%x",(ulong)(uint)constant->iValue);
          }
          else if ((((constant->super_VmValue).type.type == VM_TYPE_STRUCT) &&
                   ((constant->isReference & 1U) != 0)) && ((ctx->showContainers & 1U) != 0)) {
            Print(ctx,"*(%.*s+0x%x)",
                  (ulong)(uint)((int)(constant->container->name->name).end -
                               (int)(constant->container->name->name).begin),
                  (constant->container->name->name).begin,(ulong)(uint)constant->iValue);
          }
          else if (((constant->super_VmValue).type.type == VM_TYPE_STRUCT) &&
                  ((constant->isReference & 1U) != 0)) {
            Print(ctx,"*(0x%x)",(ulong)(constant->container->offset + constant->iValue));
          }
          else if ((constant->super_VmValue).type.type == VM_TYPE_STRUCT) {
            Print(ctx,"{ %.*s }",
                  (ulong)(uint)((int)(((constant->super_VmValue).type.structType)->name).end -
                               (int)(((constant->super_VmValue).type.structType)->name).begin),
                  (((constant->super_VmValue).type.structType)->name).begin);
          }
          else if (((constant->super_VmValue).type.type == VM_TYPE_FUNCTION) &&
                  (constant->fValue->function != (FunctionData *)0x0)) {
            Print(ctx,"%.*s.f%04x",
                  (ulong)(uint)((int)(constant->fValue->function->name->name).end -
                               (int)(constant->fValue->function->name->name).begin),
                  (constant->fValue->function->name->name).begin,
                  (ulong)constant->fValue->function->uniqueId);
          }
          else {
            if ((constant->super_VmValue).type.type != VM_TYPE_FUNCTION) {
              __assert_fail("!\"unknown type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                            ,0xd8,"void PrintConstant(InstructionVMGraphContext &, VmConstant *)");
            }
            Print(ctx,"global.f0000");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PrintConstant(InstructionVMGraphContext &ctx, VmConstant *constant)
{
	if(constant->type == VmType::Void)
		Print(ctx, "{}");
	else if(constant->type == VmType::Int && constant->isFloat)
		Print(ctx, "%ff", DecodeFloat(constant->iValue));
	else if(constant->type == VmType::Int)
		Print(ctx, "%d", constant->iValue);
	else if(constant->type == VmType::Double)
		Print(ctx, "%f", constant->dValue);
	else if(constant->type == VmType::Long)
		Print(ctx, "%lldl", constant->lValue);
	else if(constant->type.type == VM_TYPE_POINTER && constant->container && ctx.showContainers)
		Print(ctx, "%.*s+0x%x", FMT_ISTR(constant->container->name->name), constant->iValue);
	else if(constant->type.type == VM_TYPE_POINTER && constant->container)
		Print(ctx, "0x%x", constant->container->offset + constant->iValue);
	else if(constant->type.type == VM_TYPE_POINTER)
		Print(ctx, "0x%x", constant->iValue);
	else if(constant->type.type == VM_TYPE_STRUCT && constant->isReference && ctx.showContainers)
		Print(ctx, "*(%.*s+0x%x)", FMT_ISTR(constant->container->name->name), constant->iValue);
	else if(constant->type.type == VM_TYPE_STRUCT && constant->isReference)
		Print(ctx, "*(0x%x)", constant->container->offset + constant->iValue);
	else if(constant->type.type == VM_TYPE_STRUCT)
		Print(ctx, "{ %.*s }", FMT_ISTR(constant->type.structType->name));
	else if(constant->type.type == VM_TYPE_FUNCTION && constant->fValue->function)
		Print(ctx, "%.*s.f%04x", FMT_ISTR(constant->fValue->function->name->name), constant->fValue->function->uniqueId);
	else if(constant->type.type == VM_TYPE_FUNCTION)
		Print(ctx, "global.f0000");
	else
		assert(!"unknown type");
}